

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CURLcode cw_chunked_init(Curl_easy *data,Curl_cwriter *writer)

{
  void *pvVar1;
  chunked_writer *ctx;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  pvVar1 = writer->ctx;
  *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xffffefff | 0x1000;
  Curl_httpchunk_init(data,(Curl_chunker *)((long)pvVar1 + 0x20),false);
  return CURLE_OK;
}

Assistant:

static CURLcode cw_chunked_init(struct Curl_easy *data,
                                struct Curl_cwriter *writer)
{
  struct chunked_writer *ctx = writer->ctx;

  data->req.chunk = TRUE;      /* chunks coming our way. */
  Curl_httpchunk_init(data, &ctx->ch, FALSE);
  return CURLE_OK;
}